

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tt__fill_active_edges_new
               (float *scanline,float *scanline_fill,int len,nk_tt__active_edge *e,float y_top)

{
  int iVar1;
  int iVar2;
  float y1_00;
  float fVar3;
  float fVar4;
  float x1_00;
  float y1_01;
  float y1_02;
  float fVar5;
  float y2;
  float yb;
  float y3;
  float x3;
  float x2_1;
  float x1_1;
  float ya;
  int x_2;
  float t;
  float area;
  float sign;
  float step;
  float y_crossing;
  int x2;
  int x1;
  int x_1;
  int x;
  float height;
  float dy;
  float y1;
  float y0;
  float x_bottom;
  float x_top;
  float xb;
  float dx;
  float x0_1;
  float x0;
  float y_bottom;
  float y_top_local;
  nk_tt__active_edge *e_local;
  int len_local;
  float *scanline_fill_local;
  float *scanline_local;
  
  y1_00 = y_top + 1.0;
  _y_bottom = e;
  while( true ) {
    if (_y_bottom == (nk_tt__active_edge *)0x0) {
      return;
    }
    if (_y_bottom->ey < y_top) break;
    if ((_y_bottom->fdx != 0.0) || (NAN(_y_bottom->fdx))) {
      xb = _y_bottom->fx;
      fVar5 = _y_bottom->fdx;
      fVar3 = xb + fVar5;
      x = (int)_y_bottom->fdy;
      if ((y1_00 < _y_bottom->sy) || (_y_bottom->ey < y_top)) {
        __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x2d78,
                      "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                     );
      }
      dy = y_top;
      y0 = xb;
      if (y_top < _y_bottom->sy) {
        dy = _y_bottom->sy;
        y0 = fVar5 * (_y_bottom->sy - y_top) + xb;
      }
      height = y1_00;
      y1 = fVar3;
      if (_y_bottom->ey < y1_00) {
        height = _y_bottom->ey;
        y1 = fVar5 * (_y_bottom->ey - y_top) + xb;
      }
      fVar4 = y1;
      if ((((y0 < 0.0) || (y1 < 0.0)) || ((float)len <= y0)) || ((float)len <= y1)) {
        for (x1_1 = 0.0; (int)x1_1 < len; x1_1 = (float)((int)x1_1 + 1)) {
          fVar4 = (float)(int)x1_1;
          x1_00 = (float)((int)x1_1 + 1);
          y1_01 = ((float)(int)x1_1 - xb) / fVar5 + y_top;
          y1_02 = (((float)(int)x1_1 + 1.0) - xb) / fVar5 + y_top;
          if ((fVar4 <= xb) || (fVar3 <= x1_00)) {
            if ((fVar4 <= fVar3) || (xb <= x1_00)) {
              if ((fVar4 <= xb) || (fVar3 <= fVar4)) {
                if ((fVar4 <= fVar3) || (xb <= fVar4)) {
                  if ((x1_00 <= xb) || (fVar3 <= x1_00)) {
                    if ((x1_00 <= fVar3) || (xb <= x1_00)) {
                      nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar3,y1_00);
                    }
                    else {
                      nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,x1_00,y1_02);
                      nk_tt__handle_clipped_edge
                                (scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar3,y1_00);
                    }
                  }
                  else {
                    nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,x1_00,y1_02);
                    nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar3,y1_00)
                    ;
                  }
                }
                else {
                  nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar4,y1_01);
                  nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar4,y1_01,fVar3,y1_00);
                }
              }
              else {
                nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar4,y1_01);
                nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar4,y1_01,fVar3,y1_00);
              }
            }
            else {
              nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,x1_00,y1_02);
              nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar4,y1_01);
              nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar4,y1_01,fVar3,y1_00);
            }
          }
          else {
            nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,xb,y_top,fVar4,y1_01);
            nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,fVar4,y1_01,x1_00,y1_02);
            nk_tt__handle_clipped_edge(scanline,(int)x1_1,_y_bottom,x1_00,y1_02,fVar3,y1_00);
          }
        }
      }
      else if ((int)y0 == (int)y1) {
        iVar1 = (int)y0;
        if ((iVar1 < 0) || (len <= iVar1)) {
          __assert_fail("x >= 0 && x < len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                        ,0x2d95,
                        "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
                       );
        }
        scanline[iVar1] =
             _y_bottom->direction * (1.0 - ((y0 - (float)iVar1) + (y1 - (float)iVar1)) / 2.0) *
             (height - dy) + scanline[iVar1];
        scanline_fill[iVar1] = _y_bottom->direction * (height - dy) + scanline_fill[iVar1];
      }
      else {
        if (y1 < y0) {
          fVar5 = dy - y_top;
          dy = y1_00 - (height - y_top);
          y1 = y0;
          y0 = fVar4;
          x = (int)-(float)x;
          height = y1_00 - fVar5;
          xb = fVar3;
        }
        iVar1 = (int)y0;
        iVar2 = (int)y1;
        fVar3 = (((float)iVar1 + 1.0) - xb) * (float)x + y_top;
        fVar5 = _y_bottom->direction;
        x_2 = (int)(fVar5 * (fVar3 - dy));
        scanline[iVar1] = (float)x_2 * (1.0 - ((y0 - (float)iVar1) + 1.0) / 2.0) + scanline[iVar1];
        x2 = iVar1;
        while (x2 = x2 + 1, x2 < iVar2) {
          scanline[x2] = (float)x_2 + (fVar5 * (float)x) / 2.0 + scanline[x2];
          x_2 = (int)(fVar5 * (float)x + (float)x_2);
        }
        scanline[iVar2] =
             fVar5 * (1.0 - ((y1 - (float)iVar2) + 0.0) / 2.0) *
             (height - ((float)x * (float)(iVar2 - (iVar1 + 1)) + fVar3)) + (float)x_2 +
             scanline[iVar2];
        scanline_fill[iVar2] = fVar5 * (height - dy) + scanline_fill[iVar2];
      }
    }
    else {
      fVar5 = _y_bottom->fx;
      if (fVar5 < (float)len) {
        if (fVar5 < 0.0) {
          nk_tt__handle_clipped_edge(scanline_fill + -1,0,_y_bottom,fVar5,y_top,fVar5,y1_00);
        }
        else {
          nk_tt__handle_clipped_edge(scanline,(int)fVar5,_y_bottom,fVar5,y_top,fVar5,y1_00);
          nk_tt__handle_clipped_edge
                    (scanline_fill + -1,(int)fVar5 + 1,_y_bottom,fVar5,y_top,fVar5,y1_00);
        }
      }
    }
    _y_bottom = _y_bottom->next;
  }
  __assert_fail("e->ey >= y_top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x2d66,
                "void nk_tt__fill_active_edges_new(float *, float *, int, struct nk_tt__active_edge *, float)"
               );
}

Assistant:

NK_INTERN void
nk_tt__fill_active_edges_new(float *scanline, float *scanline_fill, int len,
    struct nk_tt__active_edge *e, float y_top)
{
    float y_bottom = y_top+1;
    while (e)
    {
        /* brute force every pixel */
        /* compute intersection points with top & bottom */
        NK_ASSERT(e->ey >= y_top);
        if (e->fdx == 0) {
            float x0 = e->fx;
            if (x0 < len) {
                if (x0 >= 0) {
                    nk_tt__handle_clipped_edge(scanline,(int) x0,e, x0,y_top, x0,y_bottom);
                    nk_tt__handle_clipped_edge(scanline_fill-1,(int) x0+1,e, x0,y_top, x0,y_bottom);
                } else {
                    nk_tt__handle_clipped_edge(scanline_fill-1,0,e, x0,y_top, x0,y_bottom);
                }
            }
        } else {
            float x0 = e->fx;
            float dx = e->fdx;
            float xb = x0 + dx;
            float x_top, x_bottom;
            float y0,y1;
            float dy = e->fdy;
            NK_ASSERT(e->sy <= y_bottom && e->ey >= y_top);

            /* compute endpoints of line segment clipped to this scanline (if the */
            /* line segment starts on this scanline. x0 is the intersection of the */
            /* line with y_top, but that may be off the line segment. */
            if (e->sy > y_top) {
                x_top = x0 + dx * (e->sy - y_top);
                y0 = e->sy;
            } else {
                x_top = x0;
                y0 = y_top;
            }

            if (e->ey < y_bottom) {
                x_bottom = x0 + dx * (e->ey - y_top);
                y1 = e->ey;
            } else {
                x_bottom = xb;
                y1 = y_bottom;
            }

            if (x_top >= 0 && x_bottom >= 0 && x_top < len && x_bottom < len)
            {
                /* from here on, we don't have to range check x values */
                if ((int) x_top == (int) x_bottom) {
                    float height;
                    /* simple case, only spans one pixel */
                    int x = (int) x_top;
                    height = y1 - y0;
                    NK_ASSERT(x >= 0 && x < len);
                    scanline[x] += e->direction * (1.0f-(((float)x_top - (float)x) + ((float)x_bottom-(float)x))/2.0f)  * (float)height;
                    scanline_fill[x] += e->direction * (float)height; /* everything right of this pixel is filled */
                } else {
                    int x,x1,x2;
                    float y_crossing, step, sign, area;
                    /* covers 2+ pixels */
                    if (x_top > x_bottom)
                    {
                        /* flip scanline vertically; signed area is the same */
                        float t;
                        y0 = y_bottom - (y0 - y_top);
                        y1 = y_bottom - (y1 - y_top);
                        t = y0; y0 = y1; y1 = t;
                        t = x_bottom; x_bottom = x_top; x_top = t;
                        dx = -dx;
                        dy = -dy;
                        t = x0; x0 = xb; xb = t;
                    }

                    x1 = (int) x_top;
                    x2 = (int) x_bottom;
                    /* compute intersection with y axis at x1+1 */
                    y_crossing = ((float)x1+1 - (float)x0) * (float)dy + (float)y_top;

                    sign = e->direction;
                    /* area of the rectangle covered from y0..y_crossing */
                    area = sign * (y_crossing-y0);
                    /* area of the triangle (x_top,y0), (x+1,y0), (x+1,y_crossing) */
                    scanline[x1] += area * (1.0f-((float)((float)x_top - (float)x1)+(float)(x1+1-x1))/2.0f);

                    step = sign * dy;
                    for (x = x1+1; x < x2; ++x) {
                        scanline[x] += area + step/2;
                        area += step;
                    }
                    y_crossing += (float)dy * (float)(x2 - (x1+1));

                    scanline[x2] += area + sign * (1.0f-((float)(x2-x2)+((float)x_bottom-(float)x2))/2.0f) * (y1-y_crossing);
                    scanline_fill[x2] += sign * (y1-y0);
                }
            }
            else
            {
                /* if edge goes outside of box we're drawing, we require */
                /* clipping logic. since this does not match the intended use */
                /* of this library, we use a different, very slow brute */
                /* force implementation */
                int x;
                for (x=0; x < len; ++x)
                {
                    /* cases: */
                    /* */
                    /* there can be up to two intersections with the pixel. any intersection */
                    /* with left or right edges can be handled by splitting into two (or three) */
                    /* regions. intersections with top & bottom do not necessitate case-wise logic. */
                    /* */
                    /* the old way of doing this found the intersections with the left & right edges, */
                    /* then used some simple logic to produce up to three segments in sorted order */
                    /* from top-to-bottom. however, this had a problem: if an x edge was epsilon */
                    /* across the x border, then the corresponding y position might not be distinct */
                    /* from the other y segment, and it might ignored as an empty segment. to avoid */
                    /* that, we need to explicitly produce segments based on x positions. */

                    /* rename variables to clear pairs */
                    float ya = y_top;
                    float x1 = (float) (x);
                    float x2 = (float) (x+1);
                    float x3 = xb;
                    float y3 = y_bottom;
                    float yb,y2;

                    yb = ((float)x - x0) / dx + y_top;
                    y2 = ((float)x+1 - x0) / dx + y_top;

                    if (x0 < x1 && x3 > x2) {         /* three segments descending down-right */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x1,yb);
                        nk_tt__handle_clipped_edge(scanline,x,e, x1,yb, x2,y2);
                        nk_tt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
                    } else if (x3 < x1 && x0 > x2) {  /* three segments descending down-left */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x2,y2);
                        nk_tt__handle_clipped_edge(scanline,x,e, x2,y2, x1,yb);
                        nk_tt__handle_clipped_edge(scanline,x,e, x1,yb, x3,y3);
                    } else if (x0 < x1 && x3 > x1) {  /* two segments across x, down-right */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x1,yb);
                        nk_tt__handle_clipped_edge(scanline,x,e, x1,yb, x3,y3);
                    } else if (x3 < x1 && x0 > x1) {  /* two segments across x, down-left */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x1,yb);
                        nk_tt__handle_clipped_edge(scanline,x,e, x1,yb, x3,y3);
                    } else if (x0 < x2 && x3 > x2) {  /* two segments across x+1, down-right */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x2,y2);
                        nk_tt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
                    } else if (x3 < x2 && x0 > x2) {  /* two segments across x+1, down-left */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x2,y2);
                        nk_tt__handle_clipped_edge(scanline,x,e, x2,y2, x3,y3);
                    } else {  /* one segment */
                        nk_tt__handle_clipped_edge(scanline,x,e, x0,ya, x3,y3);
                    }
                }
            }
        }
        e = e->next;
    }
}